

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O0

pair<void_*,_unsigned_long> __thiscall
asio::cancellation_slot::prepare_memory(cancellation_slot *this,size_t size,size_t align)

{
  pair<void_*,_unsigned_long> pVar1;
  int iVar2;
  undefined4 extraout_var;
  thread_info_base *ptVar3;
  pair<void_*,_unsigned_long> local_40;
  size_t local_30;
  size_t align_local;
  size_t size_local;
  cancellation_slot *this_local;
  pair<void_*,_unsigned_long> mem;
  
  local_30 = align;
  align_local = size;
  size_local = (size_t)this;
  if (this->handler_ != (cancellation_handler_base **)0x0) {
    std::pair<void_*,_unsigned_long>::pair<void_*,_unsigned_long,_true>
              ((pair<void_*,_unsigned_long> *)&this_local);
    if (*this->handler_ != (cancellation_handler_base *)0x0) {
      iVar2 = (*(*this->handler_)->_vptr_cancellation_handler_base[1])();
      local_40.first = (void *)CONCAT44(extraout_var,iVar2);
      std::pair<void_*,_unsigned_long>::operator=
                ((pair<void_*,_unsigned_long> *)&this_local,&local_40);
      *this->handler_ = (cancellation_handler_base *)0x0;
    }
    if ((mem.first < align_local) || ((ulong)this_local % local_30 != 0)) {
      if (this_local != (cancellation_slot *)0x0) {
        ptVar3 = detail::thread_context::top_of_thread_call_stack();
        detail::thread_info_base::
        deallocate<asio::detail::thread_info_base::cancellation_signal_tag>
                  (ptVar3,this_local,mem.first);
      }
      ptVar3 = detail::thread_context::top_of_thread_call_stack();
      this_local = (cancellation_slot *)
                   detail::thread_info_base::
                   allocate<asio::detail::thread_info_base::cancellation_signal_tag>
                             (ptVar3,align_local,local_30);
      mem.first = (void *)align_local;
    }
    pVar1.second = (unsigned_long)mem.first;
    pVar1.first = this_local;
    return pVar1;
  }
  __assert_fail("handler_",
                "/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/lib/discordpp/lib/asio/asio/include/asio/cancellation_signal.hpp"
                ,0x131,
                "std::pair<void *, std::size_t> asio::cancellation_slot::prepare_memory(std::size_t, std::size_t)"
               );
}

Assistant:

std::pair<void*, std::size_t> prepare_memory(
      std::size_t size, std::size_t align)
  {
    assert(handler_);
    std::pair<void*, std::size_t> mem;
    if (*handler_)
    {
      mem = (*handler_)->destroy();
      *handler_ = 0;
    }
    if (size > mem.second
        || reinterpret_cast<std::size_t>(mem.first) % align != 0)
    {
      if (mem.first)
      {
        detail::thread_info_base::deallocate(
            detail::thread_info_base::cancellation_signal_tag(),
            detail::thread_context::top_of_thread_call_stack(),
            mem.first, mem.second);
      }
      mem.first = detail::thread_info_base::allocate(
          detail::thread_info_base::cancellation_signal_tag(),
          detail::thread_context::top_of_thread_call_stack(),
          size, align);
      mem.second = size;
    }
    return mem;
  }